

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall CoreTest_FormatTo_Test::TestBody(CoreTest_FormatTo_Test *this)

{
  bool bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  file;
  type actual_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  char (*in_stack_ffffffffffffff70) [3];
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  string *this_01;
  int line;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  string local_28 [16];
  Message *in_stack_ffffffffffffffe8;
  AssertHelper *in_stack_fffffffffffffff0;
  
  this_01 = local_28;
  std::__cxx11::string::string(this_01);
  file = std::back_inserter<std::__cxx11::string>(in_stack_ffffffffffffff68);
  actual_expression =
       fmt::v5::format_to<std::__cxx11::string,char[3],int>
                 (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0.ptr_,in_stack_ffffffffffffffa8
                 );
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[3]>
            ((char *)this_01,(char *)actual_expression.container,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70
            );
  line = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffa8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1239a9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(char *)file.container,line,
               (char *)actual_expression.container);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1239f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x123a37);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(CoreTest, FormatTo) {
  // This should work without including fmt/format.h.
#ifdef FMT_FORMAT_H_
# error fmt/format.h must not be included in the core test
#endif
  std::string s;
  fmt::format_to(std::back_inserter(s), "{}", 42);
  EXPECT_EQ(s, "42");
}